

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O1

request_t * new_request(bsc_step_t step)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  request_t *prVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  undefined8 *puVar14;
  undefined8 *puVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  
  bVar20 = 0;
  if (step < bsc_s_bsc) {
    bsp_abort("bsc: a flush sync is required before posting another request. Requested superstep %d comes before current step %d\n"
              ,step);
  }
  uVar10 = step - bsc_s_bsc;
  if ((DAT_0011e38c <= uVar10) ||
     (DAT_0011e390 <=
      *(uint *)((long)DAT_0011e398 + ((ulong)(DAT_0011e394 + uVar10) % (ulong)DAT_0011e38c) * 4))) {
    uVar12 = uVar10 + 1;
    if (uVar10 + 1 < DAT_0011e38c * 2) {
      uVar12 = DAT_0011e38c * 2;
    }
    if (uVar10 < DAT_0011e38c) {
      uVar12 = DAT_0011e38c;
    }
    if (uVar12 <= uVar10) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
    }
    pvVar5 = calloc((ulong)uVar12,4);
    if (pvVar5 == (void *)0x0) {
      bsp_abort("bsc: insufficient memory; cannot allocate %u x %u bytes\n",(ulong)uVar12,4);
    }
    pvVar4 = DAT_0011e398;
    iVar3 = DAT_0011e394;
    uVar8 = (ulong)DAT_0011e38c;
    if (uVar8 != 0) {
      uVar16 = 0;
      do {
        *(undefined4 *)((long)pvVar5 + uVar16 * 4) =
             *(undefined4 *)((long)pvVar4 + ((ulong)(uint)(iVar3 + (int)uVar16) % uVar8) * 4);
        uVar16 = uVar16 + 1;
      } while (uVar8 != uVar16);
    }
    uVar1 = *(uint *)((long)pvVar5 + (ulong)uVar10 * 4);
    uVar17 = uVar1 + 1;
    if (uVar1 + 1 < DAT_0011e390 * 2) {
      uVar17 = DAT_0011e390 * 2;
    }
    if (uVar1 < DAT_0011e390) {
      uVar17 = DAT_0011e390;
    }
    if (uVar17 <= uVar1) {
      bsp_abort("bsc: cannot plan that far in the futuredue to integer overflow\n");
    }
    pvVar6 = calloc((ulong)uVar17 * (ulong)uVar12,0x58);
    pvVar4 = DAT_0011e3a0;
    iVar3 = DAT_0011e394;
    uVar2 = DAT_0011e390;
    uVar1 = DAT_0011e38c;
    if (DAT_0011e38c != 0) {
      uVar8 = (ulong)DAT_0011e390;
      uVar18 = 0;
      uVar13 = 0;
      do {
        if (uVar8 != 0) {
          iVar19 = 0;
          uVar16 = uVar8;
          uVar11 = uVar18;
          do {
            puVar14 = (undefined8 *)
                      ((ulong)(((iVar3 + uVar13) % uVar1) * uVar2 + iVar19) * 0x58 + (long)pvVar4);
            puVar15 = (undefined8 *)((ulong)uVar11 * 0x58 + (long)pvVar6);
            for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
              *puVar15 = *puVar14;
              puVar14 = puVar14 + (ulong)bVar20 * -2 + 1;
              puVar15 = puVar15 + (ulong)bVar20 * -2 + 1;
            }
            iVar19 = iVar19 + 1;
            uVar11 = uVar11 + 1;
            uVar16 = uVar16 - 1;
          } while (uVar16 != 0);
        }
        uVar13 = uVar13 + 1;
        uVar18 = uVar18 + uVar17;
      } while (uVar13 != uVar1);
    }
    free(DAT_0011e398);
    free(DAT_0011e3a0);
    DAT_0011e394 = 0;
    DAT_0011e38c = uVar12;
    DAT_0011e390 = uVar17;
    DAT_0011e398 = pvVar5;
    DAT_0011e3a0 = pvVar6;
  }
  uVar8 = (ulong)(uVar10 + DAT_0011e394) % (ulong)DAT_0011e38c;
  uVar10 = *(uint *)((long)DAT_0011e398 + uVar8 * 4);
  prVar7 = (request_t *)
           ((long)DAT_0011e3a0 + (ulong)uVar10 * 0x58 + (ulong)(DAT_0011e390 * (int)uVar8) * 0x58);
  *(uint *)((long)DAT_0011e398 + uVar8 * 4) = uVar10 + 1;
  DAT_0011e3a8 = DAT_0011e3a8 + 1;
  return prVar7;
}

Assistant:

static request_t * new_request( bsc_step_t step ) 
{
    unsigned i, j, delay;
    request_t * entry;
    state_t * const sbsc = bsc();

    if ( step < sbsc->current )
        bsp_abort("bsc: a flush sync is required before posting"
                  " another request. Requested superstep %d comes before current step %d\n",
                  step, sbsc->current );

    delay = step - sbsc->current;
    if ( delay >= sbsc->horizon || 
          sbsc->n_requests[ (sbsc->queue_start + delay) % sbsc->horizon ] 
            >= sbsc->max_requests_per_step ) {

        /* new memory allocation is necessary */
        bsc_step_t new_horizon;
        unsigned * new_n_requests;
        unsigned new_max_requests;
        request_t * new_queue;

        new_horizon = sbsc->horizon;
        if (delay >= sbsc->horizon) {
            new_horizon = MAX( 2*sbsc->horizon, delay + 1);
        }

        if ( new_horizon <= delay )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
        
        new_n_requests = calloc( new_horizon, sizeof(unsigned));
        if ( ! new_n_requests ) 
            bsp_abort("bsc: insufficient memory; "
                      "cannot allocate %u x %u bytes\n",
                new_horizon, (unsigned) sizeof(unsigned) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            j = (sbsc->queue_start + i) % sbsc->horizon;
            new_n_requests[ i ] = sbsc->n_requests[j];
        }

        new_max_requests = sbsc->max_requests_per_step; 
        if (new_max_requests <= new_n_requests[delay]) 
            new_max_requests = MAX( 2 * sbsc->max_requests_per_step, 
                    new_n_requests[delay] + 1  );

        if ( new_max_requests <= new_n_requests[delay] )
            bsp_abort("bsc: cannot plan that far in the future"
                      "due to integer overflow\n");
     
        new_queue = calloc( (size_t) new_horizon * new_max_requests, 
                            sizeof(request_t) );

        for ( i = 0; i < sbsc->horizon; ++i ) {
            for ( j = 0; j < sbsc->max_requests_per_step; ++j ){
                unsigned a = i * new_max_requests + j;
                unsigned b = (i + sbsc->queue_start) % sbsc->horizon 
                              * sbsc->max_requests_per_step + j;
                new_queue[ a ] = sbsc->queue[ b ];
            }
        }

        free( sbsc->n_requests );
        free( sbsc->queue );
        sbsc->n_requests = new_n_requests;
        sbsc->queue = new_queue;
        sbsc->horizon = new_horizon;
        sbsc->max_requests_per_step = new_max_requests;
        sbsc->queue_start = 0;
    }

    i = (delay + sbsc->queue_start) % sbsc->horizon;
    entry = sbsc->queue + i * 
        sbsc->max_requests_per_step + sbsc->n_requests[i] ;
    
    sbsc->n_requests[i] += 1;
    sbsc->total_n_outstanding_requests += 1;

    return entry;
}